

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# normalizer2impl.cpp
# Opt level: O1

void __thiscall
icu_63::Normalizer2Impl::addPropertyStarts(Normalizer2Impl *this,USetAdder *sa,UErrorCode *param_2)

{
  uint16_t uVar1;
  uint16_t uVar2;
  int iVar3;
  uint uVar4;
  int c;
  uint32_t value;
  uint local_34;
  
  c = 0;
  iVar3 = ucptrie_getRange_63(this->normTrie,0,UCPMAP_RANGE_FIXED_LEAD_SURROGATES,1,
                              (UCPMapValueFilter *)0x0,(void *)0x0,&local_34);
  while (-1 < iVar3) {
    (*(code *)sa->add)(sa->set,c);
    if ((((c != iVar3) && (2 < (local_34 & 6))) && (this->limitNoNo <= (ushort)local_34)) &&
       (((ushort)local_34 < this->minMaybeYes && (uVar1 = getFCD16(this,c), c < iVar3)))) {
      do {
        c = c + 1;
        uVar2 = getFCD16(this,c);
        if (uVar2 != uVar1) {
          (*(code *)sa->add)(sa->set,c);
          uVar1 = uVar2;
        }
      } while (c != iVar3);
    }
    c = iVar3 + 1;
    iVar3 = ucptrie_getRange_63(this->normTrie,c,UCPMAP_RANGE_FIXED_LEAD_SURROGATES,1,
                                (UCPMapValueFilter *)0x0,(void *)0x0,&local_34);
  }
  uVar4 = 0xac00;
  do {
    (*(code *)sa->add)(sa->set,uVar4);
    (*(code *)sa->add)(sa->set,uVar4 + 1);
    uVar4 = uVar4 + 0x1c & 0xffff;
  } while (uVar4 < 0xd7a4);
  (*(code *)sa->add)(sa->set,0xd7a4);
  return;
}

Assistant:

void
Normalizer2Impl::addPropertyStarts(const USetAdder *sa, UErrorCode & /*errorCode*/) const {
    // Add the start code point of each same-value range of the trie.
    UChar32 start = 0, end;
    uint32_t value;
    while ((end = ucptrie_getRange(normTrie, start, UCPMAP_RANGE_FIXED_LEAD_SURROGATES, INERT,
                                   nullptr, nullptr, &value)) >= 0) {
        sa->add(sa->set, start);
        if (start != end && isAlgorithmicNoNo((uint16_t)value) &&
                (value & Normalizer2Impl::DELTA_TCCC_MASK) > Normalizer2Impl::DELTA_TCCC_1) {
            // Range of code points with same-norm16-value algorithmic decompositions.
            // They might have different non-zero FCD16 values.
            uint16_t prevFCD16 = getFCD16(start);
            while (++start <= end) {
                uint16_t fcd16 = getFCD16(start);
                if (fcd16 != prevFCD16) {
                    sa->add(sa->set, start);
                    prevFCD16 = fcd16;
                }
            }
        }
        start = end + 1;
    }

    /* add Hangul LV syllables and LV+1 because of skippables */
    for(UChar c=Hangul::HANGUL_BASE; c<Hangul::HANGUL_LIMIT; c+=Hangul::JAMO_T_COUNT) {
        sa->add(sa->set, c);
        sa->add(sa->set, c+1);
    }
    sa->add(sa->set, Hangul::HANGUL_LIMIT); /* add Hangul+1 to continue with other properties */
}